

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  container_t *c;
  uint i;
  int iVar1;
  container_t *c_00;
  uint8_t typecode_00;
  uint8_t newtypecode;
  uint8_t local_29;
  
  i = ra_get_index(&r->high_low_container,(uint16_t)(val >> 0x10));
  if (-1 < (int)i) {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)i);
    typecode = (r->high_low_container).typecodes[i & 0xffff];
    c = (r->high_low_container).containers[i & 0xffff];
    local_29 = typecode;
    c_00 = container_remove(c,(uint16_t)val,typecode,&local_29);
    typecode_00 = local_29;
    if (c_00 != c) {
      container_free(c,typecode);
      typecode_00 = local_29;
      ra_set_container_at_index(&r->high_low_container,i,c_00,local_29);
    }
    iVar1 = container_get_cardinality(c_00,typecode_00);
    if (iVar1 == 0) {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
    else {
      ra_set_container_at_index(&r->high_low_container,i,c_00,typecode_00);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_get_cardinality(container2, newtypecode) != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}